

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_gen.cc
# Opt level: O0

CBS_ASN1_TAG parse_tag(CBS *cbs)

{
  int iVar1;
  size_t sVar2;
  byte local_35;
  uint local_34;
  uint8_t c;
  ulong uStack_30;
  CBS_ASN1_TAG tag_class;
  uint64_t num;
  CBS copy;
  CBS *cbs_local;
  
  num = (uint64_t)cbs->data;
  copy.data = (uint8_t *)cbs->len;
  copy.len = (size_t)cbs;
  iVar1 = CBS_get_u64_decimal((CBS *)&num,&stack0xffffffffffffffd0);
  if ((iVar1 == 0) || (0x1fffffff < uStack_30)) {
    ERR_put_error(0xc,0,0x91,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                  ,0x5b);
    cbs_local._4_4_ = 0;
  }
  else {
    local_34 = 0x80000000;
    iVar1 = CBS_get_u8((CBS *)&num,&local_35);
    if (iVar1 != 0) {
      switch(local_35) {
      case 0x41:
        local_34 = 0x40000000;
        break;
      default:
        ERR_put_error(0xc,0,0x90,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                      ,0x71);
        return 0;
      case 0x43:
        local_34 = 0x80000000;
        break;
      case 0x50:
        local_34 = 0xc0000000;
        break;
      case 0x55:
        local_34 = 0;
      }
      sVar2 = CBS_len((CBS *)&num);
      if (sVar2 != 0) {
        ERR_put_error(0xc,0,0x90,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                      ,0x76);
        return 0;
      }
    }
    if ((local_34 == 0) && (uStack_30 == 0)) {
      ERR_put_error(0xc,0,0x91,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                    ,0x7e);
      cbs_local._4_4_ = 0;
    }
    else {
      cbs_local._4_4_ = local_34 | (uint)uStack_30;
    }
  }
  return cbs_local._4_4_;
}

Assistant:

static CBS_ASN1_TAG parse_tag(const CBS *cbs) {
  CBS copy = *cbs;
  uint64_t num;
  if (!CBS_get_u64_decimal(&copy, &num) || num > CBS_ASN1_TAG_NUMBER_MASK) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_NUMBER);
    return 0;
  }

  CBS_ASN1_TAG tag_class = CBS_ASN1_CONTEXT_SPECIFIC;
  // The tag may be suffixed by a class.
  uint8_t c;
  if (CBS_get_u8(&copy, &c)) {
    switch (c) {
      case 'U':
        tag_class = CBS_ASN1_UNIVERSAL;
        break;
      case 'A':
        tag_class = CBS_ASN1_APPLICATION;
        break;
      case 'P':
        tag_class = CBS_ASN1_PRIVATE;
        break;
      case 'C':
        tag_class = CBS_ASN1_CONTEXT_SPECIFIC;
        break;
      default: {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_MODIFIER);
        return 0;
      }
    }
    if (CBS_len(&copy) != 0) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_MODIFIER);
      return 0;
    }
  }

  // Tag [UNIVERSAL 0] is reserved for indefinite-length end-of-contents. We
  // also use zero in this file to indicator no explicit tagging.
  if (tag_class == CBS_ASN1_UNIVERSAL && num == 0) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_NUMBER);
    return 0;
  }

  return tag_class | (CBS_ASN1_TAG)num;
}